

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter.c
# Opt level: O3

xmlChar * xml_secure_vprint(char *format,__va_list_tag *ap)

{
  uint __errnum;
  uint __errnum_00;
  char *pcVar1;
  xmlChar *pxVar2;
  undefined8 uVar3;
  va_list ap_store;
  char buf [100];
  char local_98 [112];
  
  __errnum = __vsnprintf_chk(local_98,100,1,100,format);
  uVar3 = _stderr;
  if ((int)__errnum < 0) {
    pcVar1 = strerror(__errnum);
LAB_0010e820:
    __fprintf_chk(uVar3,1,"vsnprintf failed in xml_secure_vprint: %s\n",pcVar1);
  }
  else {
    if (__errnum < 100) {
      pxVar2 = xmlEscapePropValue(local_98);
      return pxVar2;
    }
    pcVar1 = (char *)malloc((ulong)(__errnum + 1));
    if (pcVar1 == (char *)0x0) {
      pcVar1 = "memory allocation failure in xml_secure_vprint\n";
    }
    else {
      __errnum_00 = __vsnprintf_chk(pcVar1,(ulong)(__errnum + 1),1,0xffffffffffffffff,format,ap);
      if ((int)__errnum_00 < 0) {
        free(pcVar1);
        uVar3 = _stderr;
        pcVar1 = strerror(__errnum_00);
        goto LAB_0010e820;
      }
      if (__errnum_00 <= __errnum) {
        pxVar2 = xmlEscapePropValue(pcVar1);
        free(pcVar1);
        return pxVar2;
      }
      free(pcVar1);
      pcVar1 = "vsnprintf failed in xml_secure_vprint: nondeterministic message length\n";
    }
    __fprintf_chk(_stderr,1,pcVar1);
  }
  exit(1);
}

Assistant:

static xmlChar* xml_secure_vprint(const char *format, va_list ap)
{
    char buf[100];
    char *msg = buf;
    const size_t len = sizeof(buf);

    va_list ap_store;
    va_copy(ap_store, ap);
    int res = vsnprintf(msg, len, format, ap_store);
    va_end(ap_store);
    if (res < 0) {
        fprintf(stderr, "vsnprintf failed in xml_secure_vprint: %s\n", strerror(res));
        exit(EXIT_FAILURE);
    }

    if ((unsigned)res >= len) {
        size_t msglen = res+1;
        msg = malloc(msglen);
        if (!msg) {
            fprintf(stderr, "memory allocation failure in xml_secure_vprint\n");
            exit(EXIT_FAILURE);
        }
        res = vsnprintf(msg, msglen, format, ap);
        if (res < 0) {
            free(msg);
            fprintf(stderr, "vsnprintf failed in xml_secure_vprint: %s\n", strerror(res));
            exit(EXIT_FAILURE);
        }
        if ((unsigned)res >= msglen) {
            // What? Did format get longer while allocating msg?
            free(msg);
            fprintf(stderr, "vsnprintf failed in xml_secure_vprint: nondeterministic message length\n");
            exit(EXIT_FAILURE);
        }
    }

    xmlChar *xml_msg = xmlEscapePropValue(msg);
    if (msg != buf) free(msg);
    return xml_msg;
}